

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

int __thiscall QParallelAnimationGroup::duration(QParallelAnimationGroup *this)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  lVar1 = *(long *)(*(long *)(this + 8) + 0xa8);
  lVar2 = *(long *)(*(long *)(this + 8) + 0xb0);
  lVar5 = 0;
  iVar4 = 0;
  while( true ) {
    if (lVar2 << 3 == lVar5) {
      return iVar4;
    }
    iVar3 = QAbstractAnimation::totalDuration(*(QAbstractAnimation **)(lVar1 + lVar5));
    if (iVar3 == -1) break;
    if (iVar4 <= iVar3) {
      iVar4 = iVar3;
    }
    lVar5 = lVar5 + 8;
  }
  return -1;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }